

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artest2.c
# Opt level: O3

double ar_mean(double *x,int N)

{
  ulong uVar1;
  double dVar2;
  
  if (N < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + x[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return dVar2 / (double)N;
}

Assistant:

double ar_mean(double *x, int N) {
	double mn;
	int i;

	mn = 0.0;

	for(i = 0; i < N;++i) {
		mn += x[i];
	}

	mn /= (double) N;

	return mn;
}